

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbinaryast.cpp
# Opt level: O0

void __thiscall OutputStream::writeInt8(OutputStream *this,int8_t v)

{
  undefined8 in_RDX;
  undefined1 in_SIL;
  undefined8 *in_RDI;
  anon_union_1_2_9473010d conv;
  
  (**(code **)*in_RDI)(in_RDI,in_SIL,in_RDX,in_SIL);
  return;
}

Assistant:

void OutputStream::writeInt8(int8_t v) {
  union {
    uint8_t u;
    int8_t i;
  } conv;

  conv.i = v;

  writeByte(conv.u);
}